

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O3

void PrintRegister(OutputContext *ctx,uchar value)

{
  undefined7 in_register_00000031;
  char *format;
  
  switch(CONCAT71(in_register_00000031,value) & 0xffffffff) {
  case 0:
    format = "rG";
    break;
  case 1:
    format = "rF";
    break;
  case 2:
    format = "rC";
    break;
  case 3:
    format = "rR";
    break;
  default:
    Print(ctx,"r%d",value);
    return;
  }
  Print(ctx,format);
  return;
}

Assistant:

void PrintRegister(OutputContext &ctx, unsigned char value)
{
	if(value == rvrrGlobals)
		Print(ctx, "rG");
	else if(value == rvrrFrame)
		Print(ctx, "rF");
	else if(value == rvrrConstants)
		Print(ctx, "rC");
	else if(value == rvrrRegisters)
		Print(ctx, "rR");
	else
		Print(ctx, "r%d", value);
}